

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckArray2DCloseDoesNotHaveSideEffectsWhenFailing::RunImpl
          (TestCheckArray2DCloseDoesNotHaveSideEffectsWhenFailing *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  TestDetails local_d0;
  int local_ac [9];
  TestDetails local_88;
  float local_64;
  float **local_60 [3];
  float local_48 [2];
  float data [2] [2];
  ScopedCurrentTest scopedResults;
  TestResults testResults;
  TestCheckArray2DCloseDoesNotHaveSideEffectsWhenFailing *this_local;
  
  (anonymous_namespace)::g_sideEffect = 0;
  UnitTest::TestResults::TestResults
            ((TestResults *)&scopedResults.m_oldTestDetails,(TestReporter *)0x0);
  ScopedCurrentTest::ScopedCurrentTest
            ((ScopedCurrentTest *)(data + 1),(TestResults *)&scopedResults.m_oldTestDetails,
             (TestDetails *)0x0);
  local_48[0] = 0.0;
  local_48[1] = 1.0;
  data[0][0] = 3.0;
  data[0][1] = 3.0;
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_60[0] = FunctionWithSideEffects3();
  local_64 = 0.01;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_88,*ppTVar3,0x31c);
  UnitTest::CheckArray2DClose<float[2][2],float_const*const*,float>
            (pTVar1,(float (*) [2] [2])local_48,local_60,2,2,&local_64,&local_88);
  ScopedCurrentTest::~ScopedCurrentTest((ScopedCurrentTest *)(data + 1));
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_ac[0] = 1;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_d0,*ppTVar3,0x31e);
  UnitTest::CheckEqual<int,int>(pTVar1,local_ac,&(anonymous_namespace)::g_sideEffect,&local_d0);
  return;
}

Assistant:

TEST(CheckArray2DCloseDoesNotHaveSideEffectsWhenFailing)
{
    g_sideEffect = 0;
    {
        UnitTest::TestResults testResults;
		ScopedCurrentTest scopedResults(testResults);

		const float data[2][2] = { {0, 1}, {3, 3} };
        CHECK_ARRAY2D_CLOSE (data, FunctionWithSideEffects3(), 2, 2, 0.01f);
    }
    CHECK_EQUAL(1, g_sideEffect);
}